

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O0

void AddFile(char *name,basic_ostream<char,_std::char_traits<char>_> *out)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  string local_2c0 [32];
  string local_2a0 [8];
  string line;
  allocator local_279;
  string local_278 [32];
  string local_258 [32];
  char *local_238;
  char *p;
  istream local_220 [8];
  ifstream in;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  char *name_local;
  
  std::ifstream::ifstream(local_220,name,8);
  bVar1 = std::ifstream::is_open();
  local_238 = name;
  out_local = (basic_ostream<char,_std::char_traits<char>_> *)name;
  if ((bVar1 & 1) != 0) {
    for (; *local_238 != '\0'; local_238 = local_238 + 1) {
      if (*local_238 == '/') {
        out_local = (basic_ostream<char,_std::char_traits<char>_> *)(local_238 + 1);
      }
    }
    poVar3 = std::operator<<((ostream *)out,"{\"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,(char *)out_local,&local_279);
    CEscape(local_258);
    poVar3 = std::operator<<(poVar3,(string *)local_258);
    std::operator<<(poVar3,"\",\n");
    std::__cxx11::string::~string((string *)local_258);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::__cxx11::string::string(local_2a0);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_2a0);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      poVar3 = std::operator<<((ostream *)out,"  \"");
      CEscape(local_2c0);
      poVar3 = std::operator<<(poVar3,(string *)local_2c0);
      std::operator<<(poVar3,"\\n\"\n");
      std::__cxx11::string::~string((string *)local_2c0);
    }
    std::__cxx11::string::~string(local_2a0);
    std::operator<<((ostream *)out,"},\n");
    std::ifstream::~ifstream(local_220);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open input file: ");
  poVar3 = std::operator<<(poVar3,name);
  std::operator<<(poVar3,"\n");
  exit(1);
}

Assistant:

static void AddFile(const char* name, std::basic_ostream<char>* out) {
  std::ifstream in(name);

  if (!in.is_open()) {
    std::cerr << "Couldn't open input file: " << name << "\n";
    std::exit(EXIT_FAILURE);
  }

  // Make canonical name only include the final element.
  for (const char *p = name; *p; p++) {
    if (*p == '/') {
      name = p + 1;
    }
  }

  *out << "{\"" << CEscape(name) << "\",\n";

  for (std::string line; std::getline(in, line); ) {
    *out << "  \"" << CEscape(line) << "\\n\"\n";
  }

  *out << "},\n";
}